

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O3

bool __thiscall EefcFlash::getBor(EefcFlash *this)

{
  uint32_t uVar1;
  
  if (this->_canBrownout == true) {
    waitFSR(this,1);
    Samba::writeWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 4,
                     0x5a00000d);
    waitFSR(this,1);
    uVar1 = Samba::readWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 0xc
                           );
    return SUB41((uVar1 & 4) >> 2,0);
  }
  return false;
}

Assistant:

bool
EefcFlash::getBor()
{
    if (!_canBrownout)
        return false;

    waitFSR();
    writeFCR0(EEFC_FCMD_GGPB, 0);
    waitFSR();
    return (readFRR0() & (1 << 2));
}